

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::ScanLineInputFile::setFrameBuffer(ScanLineInputFile *this,FrameBuffer *frameBuffer)

{
  int iVar1;
  bool bVar2;
  Slice *pSVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *this_00;
  FrameBuffer *in_RSI;
  stringstream _iex_throw_s;
  exr_attr_chlist_entry_t *curc;
  ConstIterator j;
  lock_guard<std::mutex> lock;
  FrameBuffer *in_stack_fffffffffffffd78;
  lock_guard<std::mutex> *in_stack_fffffffffffffd80;
  value_type *in_stack_fffffffffffffd88;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *in_stack_fffffffffffffd90;
  Context *in_stack_fffffffffffffd98;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  exr_attr_chlist_entry_t *local_40;
  const_iterator local_38;
  const_iterator local_20;
  FrameBuffer *local_10;
  
  local_10 = in_RSI;
  std::
  __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x226908);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffd80,(mutex_type *)in_stack_fffffffffffffd78);
  std::
  __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x22692c);
  std::vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>::clear
            ((vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)0x22693b);
  local_20._M_node = (_Base_ptr)FrameBuffer::begin(in_stack_fffffffffffffd78);
  do {
    local_38._M_node = (_Base_ptr)FrameBuffer::end(in_stack_fffffffffffffd78);
    bVar2 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffffd80,
                                (ConstIterator *)in_stack_fffffffffffffd78);
    if (!bVar2) {
      std::
      __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x226c5e);
      FrameBuffer::operator=(local_10,in_stack_fffffffffffffd78);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x226c7e);
      return;
    }
    std::
    __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2269d3);
    FrameBuffer::ConstIterator::name((ConstIterator *)0x2269ea);
    local_40 = Context::findChannel
                         (in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                          (char *)in_stack_fffffffffffffd88);
    if (local_40 == (exr_attr_chlist_entry_t *)0x0) {
      std::
      __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x226a40);
      FrameBuffer::ConstIterator::slice((ConstIterator *)0x226a58);
      std::vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>::push_back
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
    else {
      iVar1 = local_40->x_sampling;
      pSVar3 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x226aaa);
      if ((iVar1 != pSVar3->xSampling) ||
         (iVar1 = local_40->y_sampling,
         pSVar3 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x226adb),
         iVar1 != pSVar3->ySampling)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1c8);
        poVar4 = std::operator<<(local_1b8,"X and/or y subsampling factors of \"");
        pcVar5 = FrameBuffer::ConstIterator::name((ConstIterator *)0x226b34);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of input file \"");
        pcVar5 = fileName((ScanLineInputFile *)0x226b76);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,local_1c8);
        __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    FrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd80);
  } while( true );
}

Assistant:

void
ScanLineInputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->fill_list.clear ();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt.findChannel (
            _data->partNumber, j.name ());

        if (!curc)
        {
            _data->fill_list.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    _data->frameBuffer = frameBuffer;
}